

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elu_x86_fma.cpp
# Opt level: O1

int __thiscall
ncnn::ELU_x86_fma::forward_inplace(ELU_x86_fma *this,Mat *bottom_top_blob,Option *opt)

{
  float fVar1;
  int iVar2;
  undefined1 auVar3 [32];
  int iVar4;
  uint uVar5;
  uint uVar6;
  long lVar7;
  uint uVar8;
  undefined1 (*pauVar9) [32];
  long lVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [32];
  undefined1 auVar13 [64];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar18 [16];
  undefined1 auVar25 [32];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [16];
  undefined1 auVar33 [64];
  undefined1 auVar34 [32];
  undefined1 auVar35 [16];
  undefined1 auVar36 [32];
  undefined1 auVar37 [64];
  undefined1 auVar38 [16];
  undefined1 auVar39 [32];
  undefined1 auVar40 [64];
  undefined1 auVar41 [64];
  undefined1 auVar42 [16];
  undefined1 auVar43 [32];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [64];
  undefined1 extraout_var [60];
  
  iVar2 = bottom_top_blob->c;
  if (0 < (long)iVar2) {
    uVar8 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d * bottom_top_blob->elempack
    ;
    lVar10 = 0;
    auVar33 = ZEXT1664(ZEXT816(0) << 0x40);
    auVar37 = ZEXT3264(CONCAT428(0x3f000000,
                                 CONCAT424(0x3f000000,
                                           CONCAT420(0x3f000000,
                                                     CONCAT416(0x3f000000,
                                                               CONCAT412(0x3f000000,
                                                                         CONCAT48(0x3f000000,
                                                                                  0x3f0000003f000000
                                                                                 )))))));
    auVar40 = ZEXT3264(CONCAT428(0x3f800000,
                                 CONCAT424(0x3f800000,
                                           CONCAT420(0x3f800000,
                                                     CONCAT416(0x3f800000,
                                                               CONCAT412(0x3f800000,
                                                                         CONCAT48(0x3f800000,
                                                                                  0x3f8000003f800000
                                                                                 )))))));
    auVar48 = ZEXT3264(CONCAT428(0x39506967,
                                 CONCAT424(0x39506967,
                                           CONCAT420(0x39506967,
                                                     CONCAT416(0x39506967,
                                                               CONCAT412(0x39506967,
                                                                         CONCAT48(0x39506967,
                                                                                  0x3950696739506967
                                                                                 )))))));
    auVar41 = ZEXT1664(ZEXT816(0) << 0x40);
    do {
      auVar39._8_4_ = 0x3e2aaaaa;
      auVar39._0_8_ = 0x3e2aaaaa3e2aaaaa;
      auVar36._8_4_ = 0x3d2aa9c1;
      auVar36._0_8_ = 0x3d2aa9c13d2aa9c1;
      auVar34._8_4_ = 0x3c088908;
      auVar34._0_8_ = 0x3c0889083c088908;
      auVar39._12_4_ = 0x3e2aaaaa;
      auVar36._12_4_ = 0x3d2aa9c1;
      auVar34._12_4_ = 0x3c088908;
      auVar39._16_4_ = 0x3e2aaaaa;
      auVar36._16_4_ = 0x3d2aa9c1;
      auVar34._16_4_ = 0x3c088908;
      auVar39._20_4_ = 0x3e2aaaaa;
      auVar36._20_4_ = 0x3d2aa9c1;
      auVar34._20_4_ = 0x3c088908;
      auVar39._24_4_ = 0x3e2aaaaa;
      auVar36._24_4_ = 0x3d2aa9c1;
      auVar34._24_4_ = 0x3c088908;
      auVar39._28_4_ = 0x3e2aaaaa;
      auVar36._28_4_ = 0x3d2aa9c1;
      auVar34._28_4_ = 0x3c088908;
      pauVar9 = (undefined1 (*) [32])
                (bottom_top_blob->cstep * lVar10 * bottom_top_blob->elemsize +
                (long)bottom_top_blob->data);
      if ((int)uVar8 < 8) {
        uVar6 = 0;
      }
      else {
        fVar1 = (this->super_ELU).alpha;
        auVar12._4_4_ = fVar1;
        auVar12._0_4_ = fVar1;
        auVar12._8_4_ = fVar1;
        auVar12._12_4_ = fVar1;
        auVar12._16_4_ = fVar1;
        auVar12._20_4_ = fVar1;
        auVar12._24_4_ = fVar1;
        auVar12._28_4_ = fVar1;
        iVar4 = 7;
        auVar21._8_4_ = 0x3f800000;
        auVar21._0_8_ = 0x3f8000003f800000;
        auVar21._12_4_ = 0x3f800000;
        do {
          auVar17 = vminps_avx(*pauVar9,auVar33._0_32_);
          auVar22._8_4_ = 0x42b0c0a5;
          auVar22._0_8_ = 0x42b0c0a542b0c0a5;
          auVar22._12_4_ = 0x42b0c0a5;
          auVar22._16_4_ = 0x42b0c0a5;
          auVar22._20_4_ = 0x42b0c0a5;
          auVar22._24_4_ = 0x42b0c0a5;
          auVar22._28_4_ = 0x42b0c0a5;
          auVar17 = vminps_avx(auVar17,auVar22);
          auVar23._8_4_ = 0xc2b0c0a5;
          auVar23._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar23._12_4_ = 0xc2b0c0a5;
          auVar23._16_4_ = 0xc2b0c0a5;
          auVar23._20_4_ = 0xc2b0c0a5;
          auVar23._24_4_ = 0xc2b0c0a5;
          auVar23._28_4_ = 0xc2b0c0a5;
          auVar3 = vmaxps_avx(auVar17,auVar23);
          auVar24._8_4_ = 0x3fb8aa3b;
          auVar24._0_8_ = 0x3fb8aa3b3fb8aa3b;
          auVar24._12_4_ = 0x3fb8aa3b;
          auVar24._16_4_ = 0x3fb8aa3b;
          auVar24._20_4_ = 0x3fb8aa3b;
          auVar24._24_4_ = 0x3fb8aa3b;
          auVar24._28_4_ = 0x3fb8aa3b;
          auVar14 = vfmadd213ps_fma(auVar24,auVar3,auVar37._0_32_);
          auVar16 = vroundps_avx(ZEXT1632(auVar14),1);
          auVar17 = vcmpps_avx(ZEXT1632(auVar14),auVar16,1);
          auVar17 = vandps_avx(auVar40._0_32_,auVar17);
          auVar17 = vsubps_avx(auVar16,auVar17);
          auVar30._8_4_ = 0x3f318000;
          auVar30._0_8_ = 0x3f3180003f318000;
          auVar30._12_4_ = 0x3f318000;
          auVar30._16_4_ = 0x3f318000;
          auVar30._20_4_ = 0x3f318000;
          auVar30._24_4_ = 0x3f318000;
          auVar30._28_4_ = 0x3f318000;
          auVar14 = vfmsub231ps_fma(auVar3,auVar17,auVar30);
          auVar31._8_4_ = 0x395e8083;
          auVar31._0_8_ = 0x395e8083395e8083;
          auVar31._12_4_ = 0x395e8083;
          auVar31._16_4_ = 0x395e8083;
          auVar31._20_4_ = 0x395e8083;
          auVar31._24_4_ = 0x395e8083;
          auVar31._28_4_ = 0x395e8083;
          auVar18 = vfmsub231ps_fma(ZEXT1632(auVar14),auVar17,auVar31);
          auVar16 = ZEXT1632(auVar18);
          auVar3._28_4_ = 0x395e8083;
          auVar3._0_28_ =
               ZEXT1628(CONCAT412(auVar18._12_4_ * auVar18._12_4_,
                                  CONCAT48(auVar18._8_4_ * auVar18._8_4_,
                                           CONCAT44(auVar18._4_4_ * auVar18._4_4_,
                                                    auVar18._0_4_ * auVar18._0_4_))));
          auVar43._8_4_ = 0x3ab743ce;
          auVar43._0_8_ = 0x3ab743ce3ab743ce;
          auVar43._12_4_ = 0x3ab743ce;
          auVar43._16_4_ = 0x3ab743ce;
          auVar43._20_4_ = 0x3ab743ce;
          auVar43._24_4_ = 0x3ab743ce;
          auVar43._28_4_ = 0x3ab743ce;
          auVar14 = vfmadd213ps_fma(auVar48._0_32_,auVar16,auVar43);
          auVar14 = vfmadd213ps_fma(ZEXT1632(auVar14),auVar16,auVar34);
          auVar14 = vfmadd213ps_fma(ZEXT1632(auVar14),auVar16,auVar36);
          auVar16 = ZEXT1632(auVar18);
          auVar14 = vfmadd213ps_fma(ZEXT1632(auVar14),auVar16,auVar39);
          auVar14 = vfmadd213ps_fma(ZEXT1632(auVar14),auVar16,auVar37._0_32_);
          auVar35 = vfmadd213ps_fma(ZEXT1632(auVar14),auVar3,auVar16);
          auVar14._0_4_ = (int)auVar17._0_4_;
          auVar14._4_4_ = (int)auVar17._4_4_;
          auVar14._8_4_ = (int)auVar17._8_4_;
          auVar14._12_4_ = (int)auVar17._12_4_;
          auVar16._16_4_ = (int)auVar17._16_4_;
          auVar16._0_16_ = auVar14;
          auVar16._20_4_ = (int)auVar17._20_4_;
          auVar16._24_4_ = (int)auVar17._24_4_;
          auVar16._28_4_ = (int)auVar17._28_4_;
          auVar18 = vpslld_avx(auVar14,0x17);
          auVar14 = vpslld_avx(auVar16._16_16_,0x17);
          auVar14 = vpaddd_avx(auVar21,auVar14);
          auVar18 = vpaddd_avx(auVar21,auVar18);
          auVar17._16_16_ = auVar14;
          auVar17._0_16_ = auVar18;
          auVar25._0_4_ = auVar40._0_4_ + auVar35._0_4_;
          auVar25._4_4_ = auVar40._4_4_ + auVar35._4_4_;
          auVar25._8_4_ = auVar40._8_4_ + auVar35._8_4_;
          auVar25._12_4_ = auVar40._12_4_ + auVar35._12_4_;
          auVar25._16_4_ = auVar40._16_4_ + 0.0;
          auVar25._20_4_ = auVar40._20_4_ + 0.0;
          auVar25._24_4_ = auVar40._24_4_ + 0.0;
          auVar25._28_4_ = auVar40._28_4_ + 0.0;
          auVar14 = vfmsub213ps_fma(auVar17,auVar25,auVar40._0_32_);
          auVar17 = vmaxps_avx(*pauVar9,auVar33._0_32_);
          auVar14 = vfmadd213ps_fma(ZEXT1632(auVar14),auVar12,auVar17);
          *pauVar9 = ZEXT1632(auVar14);
          pauVar9 = pauVar9 + 1;
          iVar4 = iVar4 + 8;
        } while (iVar4 < (int)uVar8);
        auVar41 = ZEXT864(0) << 0x20;
        uVar6 = uVar8 & 0xfffffff8;
      }
      auVar18._8_4_ = 0x3f800000;
      auVar18._0_8_ = 0x3f8000003f800000;
      auVar18._12_4_ = 0x3f800000;
      auVar35._8_4_ = 0x42b0c0a5;
      auVar35._0_8_ = 0x42b0c0a542b0c0a5;
      auVar35._12_4_ = 0x42b0c0a5;
      auVar42._8_4_ = 0xc2b0c0a5;
      auVar42._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar42._12_4_ = 0xc2b0c0a5;
      if ((int)(uVar6 | 3) < (int)uVar8) {
        fVar1 = (this->super_ELU).alpha;
        auVar11._4_4_ = fVar1;
        auVar11._0_4_ = fVar1;
        auVar11._8_4_ = fVar1;
        auVar11._12_4_ = fVar1;
        auVar38._8_4_ = 0x3f000000;
        auVar38._0_8_ = 0x3f0000003f000000;
        auVar38._12_4_ = 0x3f000000;
        uVar5 = uVar6;
        do {
          auVar21 = vminps_avx(auVar41._0_16_,*(undefined1 (*) [16])*pauVar9);
          auVar21 = vminps_avx(auVar35,auVar21);
          auVar15 = vmaxps_avx(auVar42,auVar21);
          auVar19._8_4_ = 0x3fb8aa3b;
          auVar19._0_8_ = 0x3fb8aa3b3fb8aa3b;
          auVar19._12_4_ = 0x3fb8aa3b;
          auVar21 = vfmadd213ps_fma(auVar19,auVar15,auVar38);
          auVar26._0_4_ = (int)auVar21._0_4_;
          auVar26._4_4_ = (int)auVar21._4_4_;
          auVar26._8_4_ = (int)auVar21._8_4_;
          auVar26._12_4_ = (int)auVar21._12_4_;
          auVar14 = vcvtdq2ps_avx(auVar26);
          auVar21 = vcmpps_avx(auVar21,auVar14,1);
          auVar21 = vandps_avx(auVar21,auVar18);
          auVar21 = vsubps_avx(auVar14,auVar21);
          auVar27._8_4_ = 0x3f318000;
          auVar27._0_8_ = 0x3f3180003f318000;
          auVar27._12_4_ = 0x3f318000;
          auVar14 = vfmsub231ps_fma(auVar15,auVar21,auVar27);
          auVar28._8_4_ = 0x395e8083;
          auVar28._0_8_ = 0x395e8083395e8083;
          auVar28._12_4_ = 0x395e8083;
          auVar15 = vfmsub231ps_fma(auVar14,auVar21,auVar28);
          auVar29._0_4_ = auVar15._0_4_ * auVar15._0_4_;
          auVar29._4_4_ = auVar15._4_4_ * auVar15._4_4_;
          auVar29._8_4_ = auVar15._8_4_ * auVar15._8_4_;
          auVar29._12_4_ = auVar15._12_4_ * auVar15._12_4_;
          auVar32._8_4_ = 0x39506967;
          auVar32._0_8_ = 0x3950696739506967;
          auVar32._12_4_ = 0x39506967;
          auVar44._8_4_ = 0x3ab743ce;
          auVar44._0_8_ = 0x3ab743ce3ab743ce;
          auVar44._12_4_ = 0x3ab743ce;
          auVar14 = vfmadd213ps_fma(auVar32,auVar15,auVar44);
          auVar45._8_4_ = 0x3c088908;
          auVar45._0_8_ = 0x3c0889083c088908;
          auVar45._12_4_ = 0x3c088908;
          auVar14 = vfmadd213ps_fma(auVar14,auVar15,auVar45);
          auVar46._8_4_ = 0x3d2aa9c1;
          auVar46._0_8_ = 0x3d2aa9c13d2aa9c1;
          auVar46._12_4_ = 0x3d2aa9c1;
          auVar14 = vfmadd213ps_fma(auVar14,auVar15,auVar46);
          auVar47._8_4_ = 0x3e2aaaaa;
          auVar47._0_8_ = 0x3e2aaaaa3e2aaaaa;
          auVar47._12_4_ = 0x3e2aaaaa;
          auVar14 = vfmadd213ps_fma(auVar14,auVar15,auVar47);
          auVar14 = vfmadd213ps_fma(auVar14,auVar15,auVar38);
          auVar14 = vfmadd213ps_fma(auVar14,auVar29,auVar15);
          auVar15._0_4_ = auVar14._0_4_ + 1.0;
          auVar15._4_4_ = auVar14._4_4_ + 1.0;
          auVar15._8_4_ = auVar14._8_4_ + 1.0;
          auVar15._12_4_ = auVar14._12_4_ + 1.0;
          auVar20._0_4_ = (int)auVar21._0_4_;
          auVar20._4_4_ = (int)auVar21._4_4_;
          auVar20._8_4_ = (int)auVar21._8_4_;
          auVar20._12_4_ = (int)auVar21._12_4_;
          auVar21 = vpslld_avx(auVar20,0x17);
          auVar21 = vpaddd_avx(auVar21,auVar18);
          auVar14 = vfmsub213ps_fma(auVar21,auVar15,auVar18);
          auVar21 = vmaxps_avx(auVar41._0_16_,*(undefined1 (*) [16])*pauVar9);
          auVar21 = vfmadd213ps_fma(auVar14,auVar11,auVar21);
          *(undefined1 (*) [16])*pauVar9 = auVar21;
          pauVar9 = (undefined1 (*) [32])(*pauVar9 + 0x10);
          uVar6 = uVar5 + 4;
          iVar4 = uVar5 + 7;
          uVar5 = uVar6;
        } while (iVar4 < (int)uVar8);
      }
      if (uVar8 - uVar6 != 0 && (int)uVar6 <= (int)uVar8) {
        lVar7 = 0;
        do {
          if (*(float *)(*pauVar9 + lVar7 * 4) < 0.0) {
            fVar1 = (this->super_ELU).alpha;
            auVar13._0_4_ = expf(*(float *)(*pauVar9 + lVar7 * 4));
            auVar13._4_60_ = extraout_var;
            auVar41 = ZEXT1664(ZEXT816(0) << 0x40);
            auVar48 = ZEXT3264(CONCAT428(0x39506967,
                                         CONCAT424(0x39506967,
                                                   CONCAT420(0x39506967,
                                                             CONCAT416(0x39506967,
                                                                       CONCAT412(0x39506967,
                                                                                 CONCAT48(0x39506967
                                                                                          ,
                                                  0x3950696739506967)))))));
            auVar40 = ZEXT3264(CONCAT428(0x3f800000,
                                         CONCAT424(0x3f800000,
                                                   CONCAT420(0x3f800000,
                                                             CONCAT416(0x3f800000,
                                                                       CONCAT412(0x3f800000,
                                                                                 CONCAT48(0x3f800000
                                                                                          ,
                                                  0x3f8000003f800000)))))));
            auVar37 = ZEXT3264(CONCAT428(0x3f000000,
                                         CONCAT424(0x3f000000,
                                                   CONCAT420(0x3f000000,
                                                             CONCAT416(0x3f000000,
                                                                       CONCAT412(0x3f000000,
                                                                                 CONCAT48(0x3f000000
                                                                                          ,
                                                  0x3f0000003f000000)))))));
            auVar33 = ZEXT1664(ZEXT816(0) << 0x40);
            auVar21 = ZEXT416((uint)fVar1);
            auVar21 = vfmsub213ss_fma(auVar13._0_16_,auVar21,auVar21);
            *(int *)(*pauVar9 + lVar7 * 4) = auVar21._0_4_;
          }
          lVar7 = lVar7 + 1;
        } while (uVar8 - uVar6 != (int)lVar7);
      }
      lVar10 = lVar10 + 1;
    } while (lVar10 != iVar2);
  }
  return 0;
}

Assistant:

int ELU_x86_fma::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int d = bottom_top_blob.d;
    int channels = bottom_top_blob.c;
    int elempack = bottom_top_blob.elempack;
    int size = w * h * d * elempack;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        int i = 0;

#if __SSE2__
#if __AVX__
#if __AVX512F__
        __m512 _alpha512 = _mm512_set1_ps(alpha);
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            _mm512_storeu_ps(ptr, elu_avx512(_p, _alpha512));

            ptr += 16;
        }
#endif // __AVX512F__
        __m256 _alpha256 = _mm256_set1_ps(alpha);
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            _mm256_storeu_ps(ptr, elu_avx(_p, _alpha256));

            ptr += 8;
        }
#endif // __AVX__
        __m128 _alpha128 = _mm_set1_ps(alpha);
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_load_ps(ptr);
            _mm_store_ps(ptr, elu_sse(_p, _alpha128));

            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            if (*ptr < 0.f)
                *ptr = alpha * (expf(*ptr) - 1.f);
            ptr++;
        }
    }

    return 0;
}